

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__file.cc
# Opt level: O2

void __thiscall xemmai::io::t_file::t_file(t_file *this,wstring_view a_path,wstring_view a_mode)

{
  wchar_t wVar1;
  wstring_view a_string;
  int iVar2;
  int *piVar3;
  int __oflag;
  wchar_t *pwVar4;
  size_t unaff_R12;
  wchar_t *unaff_R14;
  long in_FS_OFFSET;
  wstring_view a_message;
  char *local_48 [4];
  
  pwVar4 = a_mode._M_str;
  (this->super_t_sharable).super_t_owned.v_owner = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x30) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  this->v_own = true;
  if (a_mode._M_len != 2) {
    if (a_mode._M_len != 1) goto LAB_0017e881;
    wVar1 = *pwVar4;
    if (wVar1 == L'a') {
      __oflag = 0x441;
      goto LAB_0017e832;
    }
    if (wVar1 == L'r') {
      __oflag = 0;
      goto LAB_0017e832;
    }
    if (wVar1 == L'w') {
      __oflag = 0x241;
      goto LAB_0017e832;
    }
  }
  if (pwVar4[1] != L'+') {
LAB_0017e881:
    a_message._M_str = L"invalid mode.";
    a_message._M_len = 0xd;
    f_throw(a_message);
  }
  wVar1 = *pwVar4;
  if (wVar1 == L'a') {
    __oflag = 0x442;
  }
  else if (wVar1 == L'r') {
    __oflag = 2;
  }
  else {
    if (wVar1 != L'w') goto LAB_0017e881;
    __oflag = 0x242;
  }
LAB_0017e832:
  do {
    a_string._M_str = unaff_R14;
    a_string._M_len = unaff_R12;
    portable::f_convert_abi_cxx11_(a_string);
    iVar2 = open(local_48[0],__oflag,0x1ff);
    this->v_fd = iVar2;
    std::__cxx11::string::~string((string *)local_48);
    if (this->v_fd != -1) {
      return;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  portable::f_throw_system_error();
}

Assistant:

t_file::t_file(std::wstring_view a_path, std::wstring_view a_mode) : v_own(true)
{
	auto flags = [&]
	{
		switch (a_mode.size()) {
		case 1:
			switch (a_mode[0]) {
			case L'r':
				return O_RDONLY;
			case L'w':
				return O_WRONLY | O_CREAT | O_TRUNC;
			case L'a':
				return O_WRONLY | O_CREAT | O_APPEND;
			}
		case 2:
			if (a_mode[1] == L'+')
				switch (a_mode[0]) {
				case L'r':
					return O_RDWR;
				case L'w':
					return O_RDWR | O_CREAT | O_TRUNC;
				case L'a':
					return O_RDWR | O_CREAT | O_APPEND;
				}
		}
		f_throw(L"invalid mode."sv);
	}();
	while (true) {
#ifdef _WIN32
		v_fd = open(portable::f_convert(a_path).c_str(), flags, S_IREAD | S_IWRITE);
#else
		v_fd = open(portable::f_convert(a_path).c_str(), flags, S_IRWXU | S_IRWXG | S_IRWXO);
#endif
		if (v_fd != -1) break;
		if (errno != EINTR) portable::f_throw_system_error();
	}
}